

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Distance<4>::doExpand
          (Distance<4> *this,ExpandContext *param_1,ArgExprs *args)

{
  long *plVar1;
  int *piVar2;
  ExprP<tcu::Vector<float,_4>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  ExprP<float> EVar4;
  undefined8 local_20;
  long *local_18;
  SharedPtrStateBase *pSVar3;
  
  BuiltinPrecisionTests::operator-((BuiltinPrecisionTests *)&local_20,in_RCX,in_RCX + 1);
  EVar4 = length<4>((Functions *)this,(ExprP<tcu::Vector<float,_4>_> *)&local_20);
  pSVar3 = EVar4.super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_state;
  if (local_18 != (long *)0x0) {
    LOCK();
    plVar1 = local_18 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    UNLOCK();
    if ((int)*plVar1 == 0) {
      local_20 = 0;
      (**(code **)(*local_18 + 0x10))();
      pSVar3 = extraout_RDX;
    }
    LOCK();
    piVar2 = (int *)((long)local_18 + 0xc);
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) && (local_18 != (long *)0x0)) {
      (**(code **)(*local_18 + 8))();
      pSVar3 = extraout_RDX_00;
    }
  }
  EVar4.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = pSVar3;
  EVar4.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar4.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<Ret>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return length<Size>(args.a - args.b);
	}